

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O0

void __thiscall MotionBase::MotionBase(MotionBase *this,MotionBase *prevMotion)

{
  MotionBase *prevMotion_local;
  MotionBase *this_local;
  
  this->_vptr_MotionBase = (_func_int **)&PTR__MotionBase_00134390;
  this->accel = 0.0;
  if (prevMotion == (MotionBase *)0x0) {
    this->t0 = 0.0;
    this->p0 = 0.0;
    this->v0 = 0.0;
  }
  else {
    this->t0 = prevMotion->tf;
    this->p0 = prevMotion->pf;
    this->v0 = prevMotion->vf;
  }
  this->tf = this->t0;
  this->pf = this->p0;
  this->vf = this->v0;
  return;
}

Assistant:

MotionBase::MotionBase(const MotionBase *prevMotion) : accel(0.0)
{
    if (prevMotion) {
        t0 = prevMotion->tf;
        p0 = prevMotion->pf;
        v0 = prevMotion->vf;
    }
    else {
        t0 = 0.0;
        p0 = 0.0;
        v0 = 0.0;
    }
    // Derived classes should override these default values.
    // Note that (tf == t0) is used to indicate an error.
    tf = t0;
    pf = p0;
    vf = v0;
}